

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CETime.cpp
# Opt level: O1

void __thiscall CETime::CETime(CETime *this)

{
  this->_vptr_CETime = (_func_int **)&PTR__CETime_0012ec88;
  (this->time_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->time_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->time_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  init_members(this);
  return;
}

Assistant:

CETime::CETime()
{
    init_members();
}